

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugi.cpp
# Opt level: O0

xml_node NULLCPugiXML::xml_node__find_child_by_attribute1
                   (NULLCArray attr_name,NULLCArray attr_value,xml_node *ptr)

{
  xml_node *ptr_local;
  NULLCArray attr_value_local;
  NULLCArray attr_name_local;
  xml_node ret;
  
  attr_name_local.ptr._0_4_ = attr_name.len;
  if (attr_name.ptr == (char_t *)0x0) {
    nullcThrowError("attr_name is empty");
    memset((void *)((long)&attr_name_local.ptr + 4),0,8);
    xml_node::xml_node((xml_node *)((long)&attr_name_local.ptr + 4));
  }
  else if (attr_value.ptr == (char_t *)0x0) {
    nullcThrowError("attr_value is empty");
    memset((void *)((long)&attr_name_local.ptr + 4),0,8);
    xml_node::xml_node((xml_node *)((long)&attr_name_local.ptr + 4));
  }
  else {
    xml_node::xml_node((xml_node *)((long)&attr_name_local.ptr + 4));
    attr_name_local._4_8_ =
         pugi::xml_node::find_child_by_attribute(&ptr->node,attr_name.ptr,attr_value.ptr);
  }
  return (xml_node)(xml_node)attr_name_local._4_8_;
}

Assistant:

xml_node xml_node__find_child_by_attribute1(NULLCArray attr_name, NULLCArray attr_value, xml_node* ptr)
	{
		if(!attr_name.ptr)
		{
			nullcThrowError("attr_name is empty");
			return xml_node();
		}
		if(!attr_value.ptr)
		{
			nullcThrowError("attr_value is empty");
			return xml_node();
		}
		xml_node ret;
		ret.node = ptr->node.find_child_by_attribute(attr_name.ptr, attr_value.ptr);
		return ret;
	}